

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

void __thiscall
anon_unknown.dwarf_97375f::BacktraceGuard::BacktraceGuard
          (BacktraceGuard *this,cmListFileBacktrace *lfbt,cmListFileBacktrace *current)

{
  cmListFileBacktrace *current_local;
  cmListFileBacktrace *lfbt_local;
  BacktraceGuard *this_local;
  
  this->Backtrace = lfbt;
  cmListFileBacktrace::cmListFileBacktrace(&this->Previous,lfbt);
  cmListFileBacktrace::operator=(this->Backtrace,current);
  return;
}

Assistant:

BacktraceGuard(cmListFileBacktrace& lfbt, cmListFileBacktrace current)
    : Backtrace(lfbt)
    , Previous(lfbt)
  {
    this->Backtrace = std::move(current);
  }